

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderRectFilledRangeH
               (ImDrawList *draw_list,ImRect *rect,ImU32 col,float x_start_norm,float x_end_norm,
               float rounding)

{
  float fVar1;
  ImVec2 *pIVar2;
  ImVec2 *pIVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 in_XMM1_Db;
  undefined4 uVar9;
  undefined4 in_XMM1_Dc;
  undefined4 uVar10;
  undefined4 in_XMM1_Dd;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ImVec2 p1;
  ImVec2 p0;
  ImVec2 local_a0;
  float local_98;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  ImVec2 local_40;
  ImVec2 local_38;
  
  if ((x_end_norm == x_start_norm) && (!NAN(x_end_norm) && !NAN(x_start_norm))) {
    return;
  }
  fVar13 = x_start_norm;
  if (x_start_norm <= x_end_norm) {
    fVar13 = x_end_norm;
    x_end_norm = x_start_norm;
  }
  fVar8 = (rect->Min).x;
  fVar1 = (rect->Min).y;
  fVar15 = (rect->Max).x - fVar8;
  local_88 = x_end_norm * fVar15 + fVar8;
  fVar14 = fVar13 * fVar15 + fVar8;
  fVar13 = (rect->Max).y;
  local_40.x = fVar14;
  local_40.y = fVar13;
  local_38.x = local_88;
  local_38.y = fVar1;
  if ((rounding != 0.0) || (NAN(rounding))) {
    fVar12 = (fVar13 - fVar1) * 0.5;
    fVar16 = fVar15 * 0.5;
    if (fVar12 <= fVar15 * 0.5) {
      fVar16 = fVar12;
    }
    fVar16 = fVar16 + -1.0;
    if (fVar16 <= rounding) {
      rounding = fVar16;
    }
    local_98 = (float)(~-(uint)(fVar16 < 0.0) & (uint)rounding);
    local_78 = 1.0 / local_98;
    fVar8 = 1.0 - (local_88 - fVar8) * local_78;
    fVar15 = 1.5707964;
    uStack_84 = in_XMM1_Db;
    uStack_80 = in_XMM1_Dc;
    uStack_7c = in_XMM1_Dd;
    if ((0.0 < fVar8) && (fVar15 = 0.0, fVar8 < 1.0)) {
      fVar15 = acosf(fVar8);
    }
    fVar16 = 1.5707964;
    fVar8 = 1.0 - (fVar14 - (rect->Min).x) * local_78;
    if ((0.0 < fVar8) && (fVar16 = 0.0, fVar8 < 1.0)) {
      fVar16 = acosf(fVar8);
    }
    fVar8 = (rect->Min).x + local_98;
    uVar7 = -(uint)(fVar8 <= local_88);
    fVar8 = (float)(uVar7 & (uint)local_88 | ~uVar7 & (uint)fVar8);
    if ((fVar15 != fVar16) || (NAN(fVar15) || NAN(fVar16))) {
      local_a0.y = fVar13 - local_98;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_a0.x = fVar8;
      if ((fVar15 != 0.0) || (((NAN(fVar15) || (fVar16 != 1.5707964)) || (NAN(fVar16))))) {
        local_5c = fVar16;
        local_58 = fVar8;
        ImDrawList::PathArcTo(draw_list,&local_a0,local_98,3.1415927 - fVar16,3.1415927 - fVar15,3);
        local_a0.y = fVar1 + local_98;
        local_a0.x = local_58;
        ImDrawList::PathArcTo
                  (draw_list,&local_a0,local_98,fVar15 + 3.1415927,local_5c + 3.1415927,3);
      }
      else {
        local_58 = fVar8;
        ImDrawList::PathArcToFast(draw_list,&local_a0,local_98,3,6);
        local_a0.y = fVar1 + local_98;
        local_a0.x = local_58;
        ImDrawList::PathArcToFast(draw_list,&local_a0,local_98,6,9);
      }
    }
    else {
      iVar5 = (draw_list->_Path).Size;
      iVar6 = (draw_list->_Path).Capacity;
      uVar17 = 0;
      uVar18 = 0;
      uVar19 = 0;
      if (iVar5 == iVar6) {
        iVar5 = iVar5 + 1;
        if (iVar6 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = iVar6 / 2 + iVar6;
        }
        if (iVar5 < iVar4) {
          iVar5 = iVar4;
        }
        if (iVar6 < iVar5) {
          uStack_54 = 0;
          uStack_50 = 0;
          uStack_4c = 0;
          local_58 = fVar8;
          pIVar3 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
          pIVar2 = (draw_list->_Path).Data;
          if (pIVar2 != (ImVec2 *)0x0) {
            memcpy(pIVar3,pIVar2,(long)(draw_list->_Path).Size << 3);
            MemFree((draw_list->_Path).Data);
          }
          (draw_list->_Path).Data = pIVar3;
          (draw_list->_Path).Capacity = iVar5;
          fVar8 = local_58;
          uVar17 = uStack_54;
          uVar18 = uStack_50;
          uVar19 = uStack_4c;
        }
      }
      pIVar2 = (draw_list->_Path).Data;
      iVar5 = (draw_list->_Path).Size;
      pIVar2[iVar5].x = fVar8;
      pIVar2[iVar5].y = fVar13;
      iVar6 = (draw_list->_Path).Size;
      iVar4 = (draw_list->_Path).Capacity;
      iVar5 = iVar6 + 1;
      (draw_list->_Path).Size = iVar5;
      if (iVar5 == iVar4) {
        iVar6 = iVar6 + 2;
        if (iVar4 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = iVar4 / 2 + iVar4;
        }
        if (iVar6 < iVar5) {
          iVar6 = iVar5;
        }
        if (iVar4 < iVar6) {
          local_58 = fVar8;
          uStack_54 = uVar17;
          uStack_50 = uVar18;
          uStack_4c = uVar19;
          pIVar3 = (ImVec2 *)MemAlloc((long)iVar6 << 3);
          pIVar2 = (draw_list->_Path).Data;
          if (pIVar2 != (ImVec2 *)0x0) {
            memcpy(pIVar3,pIVar2,(long)(draw_list->_Path).Size << 3);
            MemFree((draw_list->_Path).Data);
          }
          (draw_list->_Path).Data = pIVar3;
          (draw_list->_Path).Capacity = iVar6;
          fVar8 = local_58;
        }
      }
      pIVar2 = (draw_list->_Path).Data;
      iVar5 = (draw_list->_Path).Size;
      pIVar2[iVar5].x = fVar8;
      pIVar2[iVar5].y = fVar1;
      (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
    }
    if ((rect->Min).x + local_98 < fVar14) {
      fVar15 = 1.0 - ((rect->Max).x - fVar14) * local_78;
      fVar8 = 1.5707964;
      uVar17 = 0;
      uVar18 = 0;
      uVar19 = 0;
      if (0.0 < fVar15) {
        fVar8 = 0.0;
        uVar17 = 0;
        uVar18 = 0;
        uVar19 = 0;
        if (fVar15 < 1.0) {
          fVar8 = acosf(fVar15);
          uVar17 = extraout_XMM0_Db;
          uVar18 = extraout_XMM0_Dc;
          uVar19 = extraout_XMM0_Dd;
        }
      }
      uVar11 = 0;
      uVar10 = 0;
      uVar9 = 0;
      fVar15 = 1.5707964;
      fVar16 = 1.0 - ((rect->Max).x - local_88) * local_78;
      if (0.0 < fVar16) {
        fVar15 = 0.0;
        uVar9 = 0;
        uVar10 = 0;
        uVar11 = 0;
        if (fVar16 < 1.0) {
          local_88 = fVar8;
          uStack_84 = uVar17;
          uStack_80 = uVar18;
          uStack_7c = uVar19;
          fVar15 = acosf(fVar16);
          uVar9 = extraout_XMM0_Db_00;
          uVar10 = extraout_XMM0_Dc_00;
          uVar11 = extraout_XMM0_Dd_00;
          fVar8 = local_88;
          uVar17 = uStack_84;
          uVar18 = uStack_80;
          uVar19 = uStack_7c;
        }
      }
      fVar16 = (rect->Max).x - local_98;
      if (fVar16 <= fVar14) {
        fVar14 = fVar16;
      }
      if ((fVar8 != fVar15) || (NAN(fVar8) || NAN(fVar15))) {
        local_a0.y = fVar1 + local_98;
        local_a0.x = fVar14;
        if (((fVar8 != 0.0) || ((NAN(fVar8) || (fVar15 != 1.5707964)))) || (NAN(fVar15))) {
          local_88 = fVar8;
          uStack_84 = uVar17;
          uStack_80 = uVar18;
          uStack_7c = uVar19;
          local_78 = fVar15;
          uStack_74 = uVar9;
          uStack_70 = uVar10;
          uStack_6c = uVar11;
          ImDrawList::PathArcTo(draw_list,&local_a0,local_98,-fVar15,-fVar8,3);
          local_a0.y = fVar13 - local_98;
          local_a0.x = fVar14;
          ImDrawList::PathArcTo(draw_list,&local_a0,local_98,local_88,local_78,3);
        }
        else {
          ImDrawList::PathArcToFast(draw_list,&local_a0,local_98,9,0xc);
          local_a0.y = fVar13 - local_98;
          local_a0.x = fVar14;
          ImDrawList::PathArcToFast(draw_list,&local_a0,local_98,0,3);
        }
      }
      else {
        iVar5 = (draw_list->_Path).Size;
        iVar6 = (draw_list->_Path).Capacity;
        if (iVar5 == iVar6) {
          iVar5 = iVar5 + 1;
          if (iVar6 == 0) {
            iVar4 = 8;
          }
          else {
            iVar4 = iVar6 / 2 + iVar6;
          }
          if (iVar5 < iVar4) {
            iVar5 = iVar4;
          }
          if (iVar6 < iVar5) {
            pIVar3 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
            pIVar2 = (draw_list->_Path).Data;
            if (pIVar2 != (ImVec2 *)0x0) {
              memcpy(pIVar3,pIVar2,(long)(draw_list->_Path).Size << 3);
              MemFree((draw_list->_Path).Data);
            }
            (draw_list->_Path).Data = pIVar3;
            (draw_list->_Path).Capacity = iVar5;
          }
        }
        pIVar2 = (draw_list->_Path).Data;
        iVar5 = (draw_list->_Path).Size;
        pIVar2[iVar5].x = fVar14;
        pIVar2[iVar5].y = fVar1;
        iVar6 = (draw_list->_Path).Size;
        iVar4 = (draw_list->_Path).Capacity;
        iVar5 = iVar6 + 1;
        (draw_list->_Path).Size = iVar5;
        if (iVar5 == iVar4) {
          iVar6 = iVar6 + 2;
          if (iVar4 == 0) {
            iVar5 = 8;
          }
          else {
            iVar5 = iVar4 / 2 + iVar4;
          }
          if (iVar6 < iVar5) {
            iVar6 = iVar5;
          }
          if (iVar4 < iVar6) {
            pIVar3 = (ImVec2 *)MemAlloc((long)iVar6 << 3);
            pIVar2 = (draw_list->_Path).Data;
            if (pIVar2 != (ImVec2 *)0x0) {
              memcpy(pIVar3,pIVar2,(long)(draw_list->_Path).Size << 3);
              MemFree((draw_list->_Path).Data);
            }
            (draw_list->_Path).Data = pIVar3;
            (draw_list->_Path).Capacity = iVar6;
          }
        }
        pIVar2 = (draw_list->_Path).Data;
        iVar5 = (draw_list->_Path).Size;
        pIVar2[iVar5].x = fVar14;
        pIVar2[iVar5].y = fVar13;
        (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
      }
    }
    ImDrawList::AddConvexPolyFilled(draw_list,(draw_list->_Path).Data,(draw_list->_Path).Size,col);
    (draw_list->_Path).Size = 0;
  }
  else if (0xffffff < col) {
    ImDrawList::PrimReserve(draw_list,6,4);
    ImDrawList::PrimRect(draw_list,&local_38,&local_40,col);
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledRangeH(ImDrawList* draw_list, const ImRect& rect, ImU32 col, float x_start_norm, float x_end_norm, float rounding)
{
    if (x_end_norm == x_start_norm)
        return;
    if (x_start_norm > x_end_norm)
        ImSwap(x_start_norm, x_end_norm);

    ImVec2 p0 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_start_norm), rect.Min.y);
    ImVec2 p1 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_end_norm), rect.Max.y);
    if (rounding == 0.0f)
    {
        draw_list->AddRectFilled(p0, p1, col, 0.0f);
        return;
    }

    rounding = ImClamp(ImMin((rect.Max.x - rect.Min.x) * 0.5f, (rect.Max.y - rect.Min.y) * 0.5f) - 1.0f, 0.0f, rounding);
    const float inv_rounding = 1.0f / rounding;
    const float arc0_b = ImAcos01(1.0f - (p0.x - rect.Min.x) * inv_rounding);
    const float arc0_e = ImAcos01(1.0f - (p1.x - rect.Min.x) * inv_rounding);
    const float half_pi = IM_PI * 0.5f; // We will == compare to this because we know this is the exact value ImAcos01 can return.
    const float x0 = ImMax(p0.x, rect.Min.x + rounding);
    if (arc0_b == arc0_e)
    {
        draw_list->PathLineTo(ImVec2(x0, p1.y));
        draw_list->PathLineTo(ImVec2(x0, p0.y));
    }
    else if (arc0_b == 0.0f && arc0_e == half_pi)
    {
        draw_list->PathArcToFast(ImVec2(x0, p1.y - rounding), rounding, 3, 6); // BL
        draw_list->PathArcToFast(ImVec2(x0, p0.y + rounding), rounding, 6, 9); // TR
    }
    else
    {
        draw_list->PathArcTo(ImVec2(x0, p1.y - rounding), rounding, IM_PI - arc0_e, IM_PI - arc0_b, 3); // BL
        draw_list->PathArcTo(ImVec2(x0, p0.y + rounding), rounding, IM_PI + arc0_b, IM_PI + arc0_e, 3); // TR
    }
    if (p1.x > rect.Min.x + rounding)
    {
        const float arc1_b = ImAcos01(1.0f - (rect.Max.x - p1.x) * inv_rounding);
        const float arc1_e = ImAcos01(1.0f - (rect.Max.x - p0.x) * inv_rounding);
        const float x1 = ImMin(p1.x, rect.Max.x - rounding);
        if (arc1_b == arc1_e)
        {
            draw_list->PathLineTo(ImVec2(x1, p0.y));
            draw_list->PathLineTo(ImVec2(x1, p1.y));
        }
        else if (arc1_b == 0.0f && arc1_e == half_pi)
        {
            draw_list->PathArcToFast(ImVec2(x1, p0.y + rounding), rounding, 9, 12); // TR
            draw_list->PathArcToFast(ImVec2(x1, p1.y - rounding), rounding, 0, 3);  // BR
        }
        else
        {
            draw_list->PathArcTo(ImVec2(x1, p0.y + rounding), rounding, -arc1_e, -arc1_b, 3); // TR
            draw_list->PathArcTo(ImVec2(x1, p1.y - rounding), rounding, +arc1_b, +arc1_e, 3); // BR
        }
    }
    draw_list->PathFillConvex(col);
}